

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_person_example.cpp
# Opt level: O0

void __thiscall person_example::only_one_attr::test_method(only_one_attr *this)

{
  undefined8 uVar1;
  bool bVar2;
  lazy_ostream *plVar3;
  undefined4 local_244;
  basic_cstring<const_char> local_240;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_230;
  basic_cstring<const_char> local_208;
  basic_cstring<const_char> local_1f8;
  basic_cstring<const_char> local_1e8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1d8;
  basic_cstring<const_char> local_1b0;
  basic_cstring<const_char> local_1a0 [8];
  PersonReadFailure *ex;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[52],_const_char_(&)[52]> local_110;
  assertion_result local_f0;
  basic_cstring<const_char> local_d8;
  basic_cstring<const_char> local_c8;
  basic_cstring<const_char> local_b8;
  basic_cstring<const_char> local_a8;
  undefined1 local_98 [8];
  Person result;
  JSONParser parser;
  allocator local_39;
  string local_38 [8];
  string json;
  only_one_attr *this_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38," { \"age\": 38 } ",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  yajp::JSONParser::JSONParser((JSONParser *)&result.age,(string *)local_38,false);
  Person::Person((Person *)local_98);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/matiu2[P]yajp/tests/parser/test_person_example.cpp"
               ,0x69);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_b8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_a8,0x86,&local_b8);
    readPerson((JSONParser *)&result.age,(Person *)local_98);
    do {
      uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_c8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/matiu2[P]yajp/tests/parser/test_person_example.cpp"
                 ,0x69);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_d8);
      boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_c8,0x86,&local_d8);
      boost::test_tools::assertion_result::assertion_result(&local_f0,false);
      plVar3 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (&local_110,plVar3,
                 (char (*) [52])"exception PersonReadFailure expected but not raised");
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)&ex,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/matiu2[P]yajp/tests/parser/test_person_example.cpp"
                 ,0x69);
      boost::test_tools::tt_detail::report_assertion(&local_f0,&local_110,&ex,0x86,2,1,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[52],_const_char_(&)[52]>::
      ~lazy_ostream_impl(&local_110);
      boost::test_tools::assertion_result::~assertion_result(&local_f0);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_1a0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/matiu2[P]yajp/tests/parser/test_person_example.cpp"
               ,0x69);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1b0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,local_1a0,0x87,&local_1b0);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1d8,plVar3,(char (*) [1])0x11f71f);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1e8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/matiu2[P]yajp/tests/parser/test_person_example.cpp"
               ,0x69);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char[1],std::__cxx11::string>
              (&local_1d8,&local_1e8,0x87,1,2,"","\"\"",local_98,"result.name");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1d8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1f8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/matiu2[P]yajp/tests/parser/test_person_example.cpp"
               ,0x69);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_208);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1f8,0x88,&local_208);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_230,plVar3,(char (*) [1])0x11f71f);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_240,
               "/workspace/llm4binary/github/license_all_cmakelists_25/matiu2[P]yajp/tests/parser/test_person_example.cpp"
               ,0x69);
    local_244 = 0x26;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,unsigned_short>
              (&local_230,&local_240,0x88,1,2,&local_244,"38",&result.field_0x18,"result.age");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_230);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Person::~Person((Person *)local_98);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE( only_one_attr ) {
    std::string json(R"( { "age": 38 } )");
    yajp::JSONParser parser(json);
    Person result;
    BOOST_REQUIRE_THROW(readPerson(parser, result), PersonReadFailure);
    BOOST_CHECK_EQUAL("", result.name);
    BOOST_CHECK_EQUAL(38, result.age);
}